

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

int main(int ac,char **av)

{
  char *pcVar1;
  uint ac_00;
  int iVar2;
  int iVar3;
  char **av_00;
  uv_loop_t *loop;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  allocator local_3a1;
  undefined4 local_3a0;
  uint local_39c;
  string target;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  string config;
  CommandLineArguments args;
  string local_308;
  cmake local_2e8;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc(&args);
  av_00 = cmsys::Encoding::CommandLineArguments::argv(&args);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*av_00);
  if (1 < (int)ac_00) {
    pcVar1 = av_00[1];
    iVar2 = strcmp(pcVar1,"--build");
    if (iVar2 == 0) {
      target._M_dataplus._M_p = (pointer)&target.field_2;
      target._M_string_length = 0;
      target.field_2._M_allocated_capacity =
           target.field_2._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::string((string *)&config,"Debug",(allocator *)&local_2e8);
      dir._M_dataplus._M_p = (pointer)&dir.field_2;
      dir._M_string_length = 0;
      dir.field_2._M_local_buf[0] = '\0';
      nativeOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nativeOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      nativeOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar2 = 1;
      uVar6 = 2;
      local_3a0 = 0;
      local_39c = 0;
      while( true ) {
        if (ac_00 == uVar6) break;
        if (iVar2 == 4) {
          std::__cxx11::string::string((string *)&local_2e8,av_00[uVar6],(allocator *)&local_308);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &nativeOptions,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e8
                    );
          std::__cxx11::string::~string((string *)&local_2e8);
LAB_0029e755:
          iVar2 = 4;
        }
        else {
          pcVar1 = av_00[uVar6];
          iVar3 = strcmp(pcVar1,"--target");
          if (iVar3 == 0) {
            if ((local_39c & 1) != 0) {
              std::operator<<((ostream *)&std::cerr,
                              "\'--target\' may not be specified more than once.\n\n");
              std::__cxx11::string::assign((char *)&dir);
              break;
            }
            local_39c = 1;
            iVar2 = 2;
          }
          else {
            iVar3 = strcmp(pcVar1,"--config");
            if (iVar3 == 0) {
              iVar2 = 3;
            }
            else {
              iVar3 = strcmp(pcVar1,"--clean-first");
              if (iVar3 == 0) {
                local_3a0 = 1;
                iVar2 = 0;
              }
              else {
                iVar3 = strcmp(pcVar1,"--use-stderr");
                if (iVar3 != 0) {
                  if (((*pcVar1 == '-') && (pcVar1[1] == '-')) && (pcVar1[2] == '\0'))
                  goto LAB_0029e755;
                  if (iVar2 == 3) {
                    psVar5 = &config;
                  }
                  else {
                    psVar5 = &target;
                    if (iVar2 != 2) {
                      if (iVar2 == 1) {
                        std::__cxx11::string::string((string *)&local_308,pcVar1,&local_3a1);
                        cmsys::SystemTools::CollapseFullPath((string *)&local_2e8,&local_308);
                        std::__cxx11::string::operator=((string *)&dir,(string *)&local_2e8);
                        std::__cxx11::string::~string((string *)&local_2e8);
                        std::__cxx11::string::~string((string *)&local_308);
                        iVar2 = 0;
                      }
                      else {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
                        poVar4 = std::operator<<(poVar4,av_00[uVar6]);
                        std::endl<char,std::char_traits<char>>(poVar4);
                        std::__cxx11::string::assign((char *)&dir);
                      }
                      goto LAB_0029e859;
                    }
                  }
                  std::__cxx11::string::assign((char *)psVar5);
                  iVar2 = 0;
                }
              }
            }
          }
        }
LAB_0029e859:
        uVar6 = uVar6 + 1;
      }
      if (dir._M_string_length == 0) {
        std::operator<<((ostream *)&std::cerr,
                        "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --target <tgt> = Build <tgt> instead of default targets.\n                   May only be specified once.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --use-stderr   = Ignored.  Behavior is default in CMake >= 3.0.\n  --             = Pass remaining options to the native tool.\n"
                       );
        iVar2 = 1;
      }
      else {
        cmake::cmake(&local_2e8,RoleInternal);
        cmSystemTools::SetMessageCallback(cmakemainMessageCallback,&local_2e8);
        cmake::SetProgressCallback(&local_2e8,cmakemainProgressCallback,&local_2e8);
        iVar2 = cmake::Build(&local_2e8,&dir,&target,&config,&nativeOptions,
                             (bool)((byte)local_3a0 & 1));
        cmake::~cmake(&local_2e8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&nativeOptions);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::~string((string *)&config);
      std::__cxx11::string::~string((string *)&target);
      goto LAB_0029e691;
    }
    if (((*pcVar1 == '-') && (pcVar1[1] == 'E')) && (pcVar1[2] == '\0')) {
      target._M_dataplus._M_p = (pointer)0x0;
      target._M_string_length = 0;
      target.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&target,(ulong)(ac_00 - 1));
      std::__cxx11::string::string((string *)&local_2e8,*av_00,(allocator *)&config);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&target,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&target,
                 (const_iterator)target._M_string_length,av_00 + 2,av_00 + ac_00);
      iVar2 = cmcmd::ExecuteCMakeCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&target);
      goto LAB_0029e691;
    }
  }
  iVar2 = do_cmake(ac_00,av_00);
  cmDynamicLoader::FlushCache();
  loop = uv_default_loop();
  uv_loop_close(loop);
LAB_0029e691:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return iVar2;
}

Assistant:

int main(int ac, char const* const* av)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

#if defined(CMAKE_USE_LIBUV) && defined(_WIN32)
  // Perform libuv one-time initialization now, and then un-do its
  // global _fmode setting so that using libuv does not change the
  // default file text/binary mode.  See libuv issue 840.
  uv_loop_close(uv_default_loop());
#ifdef _MSC_VER
  _set_fmode(_O_TEXT);
#else
  _fmode = _O_TEXT;
#endif
#endif

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(av[0]);
  if (ac > 1) {
    if (strcmp(av[1], "--build") == 0) {
      return do_build(ac, av);
    }
    if (strcmp(av[1], "-E") == 0) {
      return do_command(ac, av);
    }
  }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
#ifdef CMAKE_USE_LIBUV
  uv_loop_close(uv_default_loop());
#endif
  return ret;
}